

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O1

DecodeStatus DecodePostIdxReg(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  bool bVar1;
  DecodeStatus DVar2;
  DecodeStatus DVar3;
  
  DVar2 = DecodeGPRnopcRegisterClass(Inst,Insn & 0xf,Address,Decoder);
  bVar1 = true;
  if ((DVar2 != MCDisassembler_Success) && (DVar2 != MCDisassembler_SoftFail)) {
    if (DVar2 != MCDisassembler_Fail) {
      DVar2 = MCDisassembler_Success;
    }
    bVar1 = false;
  }
  DVar3 = MCDisassembler_Fail;
  if (bVar1) {
    MCOperand_CreateImm0(Inst,(ulong)(Insn >> 4 & 1));
    DVar3 = DVar2;
  }
  return DVar3;
}

Assistant:

static DecodeStatus DecodePostIdxReg(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned Rm = fieldFromInstruction_4(Insn, 0, 4);
	unsigned add = fieldFromInstruction_4(Insn, 4, 1);

	if (!Check(&S, DecodeGPRnopcRegisterClass(Inst, Rm, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, add);

	return S;
}